

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

LY_ERR lyxml_next_attr_content
                 (lyxml_ctx *xmlctx,char **value,size_t *value_len,ly_bool *ws_only,ly_bool *dynamic
                 )

{
  uint uVar1;
  LY_ERR LVar2;
  byte *str;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  ly_in *plVar6;
  char *pcVar7;
  ly_ctx *ctx;
  
  do {
    plVar6 = xmlctx->in;
    bVar5 = *plVar6->current;
    if (bVar5 < 0xd) {
      if (bVar5 != 9) {
        if (bVar5 != 10) {
          if (bVar5 == 0) goto LAB_001a21de;
          goto LAB_001a2148;
        }
        plVar6->line = plVar6->line + 1;
      }
    }
    else if ((bVar5 != 0xd) && (bVar5 != 0x20)) break;
    ly_in_skip(plVar6,1);
  } while( true );
  if (bVar5 == 0x3d) {
    ly_in_skip(plVar6,1);
    plVar6 = xmlctx->in;
    str = (byte *)plVar6->current;
    bVar5 = *str;
    if (bVar5 != 0) {
      while (uVar3 = (ulong)bVar5, bVar5 < 0x28) {
        if ((0x100002200U >> (uVar3 & 0x3f) & 1) == 0) {
          if (uVar3 != 10) {
            if ((0x8400000000U >> (uVar3 & 0x3f) & 1) != 0) {
              ly_in_skip(plVar6,1);
              if (*xmlctx->in->current != '\0') {
                LVar2 = lyxml_parse_value(xmlctx,bVar5,value,value_len,ws_only,dynamic);
                if (LVar2 != LY_SUCCESS) {
                  return LVar2;
                }
                ly_in_skip(xmlctx->in,1);
                return LY_SUCCESS;
              }
              goto LAB_001a21de;
            }
            break;
          }
          plVar6->line = plVar6->line + 1;
        }
        ly_in_skip(plVar6,1);
        plVar6 = xmlctx->in;
        str = (byte *)plVar6->current;
        bVar5 = *str;
      }
      if (bVar5 != 0) {
        ctx = xmlctx->ctx;
        uVar1 = LY_VCODE_INSTREXP_len((char *)str);
        pcVar7 = xmlctx->in->current;
        pcVar4 = "either single or double quotation mark";
        goto LAB_001a2162;
      }
    }
LAB_001a21de:
    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
  }
  else {
LAB_001a2148:
    ctx = xmlctx->ctx;
    uVar1 = LY_VCODE_INSTREXP_len(plVar6->current);
    pcVar7 = xmlctx->in->current;
    pcVar4 = "\'=\'";
LAB_001a2162:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
            (ulong)uVar1,pcVar7,pcVar4);
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_next_attr_content(struct lyxml_ctx *xmlctx, const char **value, size_t *value_len, ly_bool *ws_only, ly_bool *dynamic)
{
    char quot;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* skip '=' */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if (xmlctx->in->current[0] != '=') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "'='");
        return LY_EVALID;
    }
    move_input(xmlctx, 1);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* find quotes */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if ((xmlctx->in->current[0] != '\'') && (xmlctx->in->current[0] != '\"')) {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "either single or double quotation mark");
        return LY_EVALID;
    }

    /* remember quote */
    quot = xmlctx->in->current[0];
    move_input(xmlctx, 1);

    /* parse attribute value */
    LY_CHECK_RET(lyxml_parse_value(xmlctx, quot, (char **)value, value_len, ws_only, dynamic));

    /* move after ending quote (without checking for EOF) */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}